

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder.c
# Opt level: O1

lzma_ret lzma_stream_encoder(lzma_stream *strm,lzma_filter *filters,lzma_check check)

{
  lzma_internal *plVar1;
  bool bVar2;
  lzma_ret lVar3;
  lzma_ret lVar4;
  
  lVar3 = lzma_strm_init(strm);
  if (lVar3 == LZMA_OK) {
    lVar4 = lzma_stream_encoder_init
                      ((lzma_next_coder_conflict2 *)strm->internal,strm->allocator,filters,check);
    if (lVar4 == LZMA_OK) {
      bVar2 = true;
    }
    else {
      lzma_end(strm);
      bVar2 = false;
      lVar3 = lVar4;
    }
  }
  else {
    bVar2 = false;
  }
  if (bVar2) {
    plVar1 = strm->internal;
    plVar1->supported_actions[0] = true;
    plVar1->supported_actions[1] = true;
    plVar1->supported_actions[2] = true;
    plVar1->supported_actions[3] = true;
    lVar3 = LZMA_OK;
  }
  return lVar3;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_stream_encoder(lzma_stream *strm,
		const lzma_filter *filters, lzma_check check)
{
	lzma_next_strm_init2(lzma_stream_encoder_init, strm, filters, check);

	strm->internal->supported_actions[LZMA_RUN] = true;
	strm->internal->supported_actions[LZMA_SYNC_FLUSH] = true;
	strm->internal->supported_actions[LZMA_FULL_FLUSH] = true;
	strm->internal->supported_actions[LZMA_FINISH] = true;

	return LZMA_OK;
}